

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_string<int,int>(int *lhs,string *op,int *rhs)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RDI;
  ostringstream os;
  int *in_stack_fffffffffffffdf8;
  string local_1e8 [48];
  string local_1b8 [32];
  ostringstream local_198 [408];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<int>(in_stack_fffffffffffffdf8);
  poVar1 = std::operator<<((ostream *)local_198,local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1," ");
  to_string<int>(in_stack_fffffffffffffdf8);
  std::operator<<(poVar1,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(in_RDI,(string *)&stack0xfffffffffffffdf8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}